

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCLocaleEnvironmentScope.cxx
# Opt level: O0

void __thiscall
cmCLocaleEnvironmentScope::SetEnv(cmCLocaleEnvironmentScope *this,string *key,string *value)

{
  ulong uVar1;
  char *value_00;
  ostream *poVar2;
  string local_238;
  undefined1 local_218 [8];
  ostringstream tmp;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined1 local_40 [8];
  string oldValue;
  string *value_local;
  string *key_local;
  cmCLocaleEnvironmentScope *this_local;
  
  oldValue.field_2._8_8_ = value;
  GetEnv((string *)local_40,this,key);
  std::make_pair<std::__cxx11::string_const&,std::__cxx11::string&>
            (&local_80,key,(string *)local_40);
  std::
  map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)this,&local_80);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_80);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    poVar2 = std::operator<<((ostream *)local_218,(string *)key);
    poVar2 = std::operator<<(poVar2,"=");
    std::operator<<(poVar2,(string *)oldValue.field_2._8_8_);
    std::__cxx11::ostringstream::str();
    cmsys::SystemTools::PutEnv(&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
  }
  else {
    value_00 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::UnsetEnv(value_00);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmCLocaleEnvironmentScope::SetEnv(std::string const& key,
                                       std::string const& value)
{
  std::string oldValue = this->GetEnv(key);

  this->EnvironmentBackup.insert(std::make_pair(key, oldValue));

  if (value.empty()) {
    cmSystemTools::UnsetEnv(key.c_str());
  } else {
    std::ostringstream tmp;
    tmp << key << "=" << value;
    cmSystemTools::PutEnv(tmp.str());
  }
}